

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::OneofDescriptorProto::InternalSerializeWithCachedSizesToArray
          (OneofDescriptorProto *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  OneofOptions *this_00;
  void *pvVar2;
  uint8 *target_00;
  uint8 *local_30;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  local_30 = target;
  if ((uVar1 & 1) != 0) {
    local_30 = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,(this->name_).ptr_,target);
  }
  if ((uVar1 & 2) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_30);
    this_00 = this->options_;
    *local_30 = '\x12';
    target_00 = io::CodedOutputStream::WriteVarint32ToArray
                          ((this_00->_cached_size_).size_.super___atomic_base<int>._M_i,local_30 + 1
                          );
    local_30 = OneofOptions::InternalSerializeWithCachedSizesToArray(this_00,target_00,stream);
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    local_30 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                         ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe),local_30,stream);
  }
  return local_30;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* OneofDescriptorProto::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.OneofDescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.OneofDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // optional .google.protobuf.OneofOptions options = 2;
  if (cached_has_bits & 0x00000002u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(
        2, _Internal::options(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.OneofDescriptorProto)
  return target;
}